

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O0

LispPTR UFS_renamefile(LispPTR *args)

{
  int iVar1;
  LispPTR *pLVar2;
  OneDArray *pOVar3;
  ulong uVar4;
  DLword *pDVar5;
  int *piVar6;
  bool bVar7;
  LispPTR local_30d4;
  LispPTR local_30cc;
  ulong local_30c0;
  size_t lf_ii_1;
  size_t lf_i_1;
  char *lf_dptr_1;
  char *lf_sptr_1;
  size_t lf_length_1;
  short *lf_sbase_1;
  char *lf_dp_1;
  char *lf_base_1;
  OneDArray *lf_arrayp_3;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp_2;
  OneDArray *lf_arrayp_1;
  OneDArray *lf_arrayp;
  int len;
  int rval;
  char dst [4096];
  char src [4096];
  char fbuf [4096];
  LispPTR *args_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);
    pLVar2 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar2 + 6) == 'C') {
      lf_arrayp._0_4_ = pLVar2[2];
    }
    else if (*(char *)((long)pLVar2 + 6) == 'D') {
      lf_arrayp._0_4_ = pLVar2[2] << 1;
    }
    else {
      error("LispStringLength: Not a character array.\n");
    }
    lf_arrayp._0_4_ = (LispPTR)lf_arrayp + 1;
    if ((int)(LispPTR)lf_arrayp < 0x1001) {
      pLVar2 = NativeAligned4FromLAddr(args[1]);
      if (*(char *)((long)pLVar2 + 6) == 'C') {
        lf_arrayp._0_4_ = pLVar2[2];
      }
      else if (*(char *)((long)pLVar2 + 6) == 'D') {
        lf_arrayp._0_4_ = pLVar2[2] << 1;
      }
      else {
        error("LispStringLength: Not a character array.\n");
      }
      if ((int)((LispPTR)lf_arrayp + 1) < 0x1001) {
        pLVar2 = NativeAligned4FromLAddr(*args);
        if ((int)pLVar2[2] < 0x1000) {
          local_30cc = pLVar2[2];
        }
        else {
          local_30cc = 0x1000;
        }
        pOVar3 = (OneDArray *)(long)(int)local_30cc;
        if (*(char *)((long)pLVar2 + 6) == 'C') {
          pDVar5 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
          lf_i = (size_t)(src + 0xff8);
          lf_dptr = (char *)((long)pDVar5 + (long)(int)(uint)(ushort)pLVar2[1]);
          for (lf_ii = 0; lf_ii < pOVar3; lf_ii = lf_ii + 1) {
            *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
            lf_i = lf_i + 1;
            lf_dptr = lf_dptr + 1;
          }
          (src + 0xff8)[(long)pOVar3] = '\0';
        }
        else if (*(char *)((long)pLVar2 + 6) == 'D') {
          pDVar5 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
          lf_length = (size_t)(pDVar5 + (int)(uint)(ushort)pLVar2[1]);
          lf_sbase = (short *)(src + 0xff8);
          for (lf_arrayp_3 = (OneDArray *)0x0; lf_arrayp_3 < pOVar3;
              lf_arrayp_3 = (OneDArray *)&lf_arrayp_3->field_0x1) {
            *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
            lf_length = lf_length + 2;
            lf_sbase = (short *)((long)lf_sbase + 1);
          }
          *(undefined1 *)lf_sbase = 0;
        }
        else {
          error("LispStringToCString: Not a character array.\n");
        }
        iVar1 = unixpathname(src + 0xff8,dst + 0xff8,0,0);
        if (iVar1 == 0) {
          args_local._4_4_ = 0;
        }
        else {
          pLVar2 = NativeAligned4FromLAddr(args[1]);
          if ((int)pLVar2[2] < 0x1000) {
            local_30d4 = pLVar2[2];
          }
          else {
            local_30d4 = 0x1000;
          }
          uVar4 = (ulong)(int)local_30d4;
          if (*(char *)((long)pLVar2 + 6) == 'C') {
            pDVar5 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
            lf_i_1 = (size_t)(src + 0xff8);
            lf_dptr_1 = (char *)((long)pDVar5 + (long)(int)(uint)(ushort)pLVar2[1]);
            for (lf_ii_1 = 0; lf_ii_1 < uVar4; lf_ii_1 = lf_ii_1 + 1) {
              *(undefined1 *)lf_i_1 = *(undefined1 *)((ulong)lf_dptr_1 ^ 3);
              lf_i_1 = lf_i_1 + 1;
              lf_dptr_1 = lf_dptr_1 + 1;
            }
            src[uVar4 + 0xff8] = '\0';
          }
          else if (*(char *)((long)pLVar2 + 6) == 'D') {
            pDVar5 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
            lf_length_1 = (size_t)(pDVar5 + (int)(uint)(ushort)pLVar2[1]);
            lf_sbase_1 = (short *)(src + 0xff8);
            for (local_30c0 = 0; local_30c0 < uVar4; local_30c0 = local_30c0 + 1) {
              *(char *)lf_sbase_1 = (char)*(undefined2 *)(lf_length_1 ^ 2);
              lf_length_1 = lf_length_1 + 2;
              lf_sbase_1 = (short *)((long)lf_sbase_1 + 1);
            }
            *(undefined1 *)lf_sbase_1 = 0;
          }
          else {
            error("LispStringToCString: Not a character array.\n");
          }
          iVar1 = unixpathname(src + 0xff8,(char *)&len,0,0);
          if (iVar1 == 0) {
            args_local._4_4_ = 0;
          }
          else {
            alarm(TIMEOUT_TIME);
            do {
              piVar6 = __errno_location();
              *piVar6 = 0;
              iVar1 = rename(dst + 0xff8,(char *)&len);
              bVar7 = false;
              if (iVar1 == -1) {
                piVar6 = __errno_location();
                bVar7 = *piVar6 == 4;
              }
            } while (bVar7);
            alarm(0);
            if (iVar1 == -1) {
              piVar6 = __errno_location();
              *Lisp_errno = *piVar6;
              args_local._4_4_ = 0;
            }
            else {
              args_local._4_4_ = 0x4c;
            }
          }
        }
      }
      else {
        *Lisp_errno = 200;
        args_local._4_4_ = 0;
      }
    }
    else {
      *Lisp_errno = 200;
      args_local._4_4_ = 0;
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR UFS_renamefile(LispPTR *args)
{
  char fbuf[MAXPATHLEN], src[MAXPATHLEN], dst[MAXPATHLEN];
  int rval, len;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)(NativeAligned4FromLAddr(args[2]));

  LispStringLength(args[0], len, rval);
  len += 1;
  if (len > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringLength(args[1], len, rval);
  len += 1;
  if (len > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], fbuf, MAXPATHLEN);
#ifdef DOS
  if (unixpathname(fbuf, src, 0, 0, 0, 0, 0) == 0) return (NIL);
#else
  if (unixpathname(fbuf, src, 0, 0) == 0) return (NIL);
#endif /* DOS */
  LispStringToCString(args[1], fbuf, MAXPATHLEN);
#ifdef DOS
  if (unixpathname(fbuf, dst, 0, 0, 0, 0, 0) == 0) return (NIL);
#else
  if (unixpathname(fbuf, dst, 0, 0) == 0) return (NIL);
#endif /* DOS */

  TIMEOUT(rval = rename(src, dst));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  return (ATOM_T);
}